

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderRenderingPointsCase::GeometryShaderRenderingPointsCase
          (GeometryShaderRenderingPointsCase *this,Context *context,ExtParameters *extParams,
          char *name,GLenum drawcall_mode,_shader_output_type output_type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  float *pfVar8;
  uchar *puVar9;
  TestError *pTVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint rendertarget_width;
  uint rendertarget_height;
  
  GeometryShaderRenderingCase::GeometryShaderRenderingCase
            (&this->super_GeometryShaderRenderingCase,context,extParams,name,
             "Verifies all draw calls work correctly for specific input+output+draw call mode combination"
            );
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingPointsCase_01df9240;
  *(_shader_output_type *)&(this->super_GeometryShaderRenderingCase).field_0x304 = output_type;
  if (drawcall_mode == 0) {
    if (output_type < SHADER_OUTPUT_TYPE_COUNT) {
      _rendertarget_width = 0;
      getRenderTargetSize(this,1,&rendertarget_width,&rendertarget_height);
      uVar6 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[0xb])(this);
      pfVar8 = (float *)operator_new__((ulong)(uVar6 & 0xfffffffc));
      this->m_raw_array_data = pfVar8;
      iVar3 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
      fVar17 = 2.0 / (float)(_rendertarget_width >> 0x20);
      fVar18 = 3.5 / (float)(_rendertarget_width >> 0x20);
      iVar13 = 3;
      lVar14 = 0;
      iVar15 = 0;
      do {
        if (lVar14 == 0x80) {
          uVar6 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                    super_TestNode._vptr_TestNode[0xe])(this,0);
          uVar7 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                    super_TestNode._vptr_TestNode[0x10])(this,0);
          pfVar8 = (float *)operator_new__((ulong)(uVar6 & 0xfffffffc));
          this->m_unordered_array_data = pfVar8;
          puVar9 = (uchar *)operator_new__((ulong)uVar7);
          this->m_unordered_elements_data = puVar9;
          lVar11 = 0;
          for (lVar14 = 0x80; lVar14 != 0; lVar14 = lVar14 + -0x10) {
            puVar2 = (undefined8 *)((long)this->m_raw_array_data + lVar14 + -0x10);
            uVar4 = puVar2[1];
            puVar1 = (undefined8 *)((long)this->m_unordered_array_data + lVar11);
            *puVar1 = *puVar2;
            puVar1[1] = uVar4;
            lVar11 = lVar11 + 0x10;
          }
          bVar5 = 0;
          for (uVar12 = 0; uVar12 != 8; uVar12 = uVar12 + 1) {
            this->m_unordered_elements_data[uVar12] = (byte)(uVar12 >> 2) | bVar5 & 6;
            bVar5 = bVar5 + 2;
          }
          return;
        }
        if (iVar3 == 0) {
          iVar16 = iVar15 * 5 + 1;
          fVar19 = fVar17 + fVar17 + -1.0;
        }
        else if (iVar3 == 2) {
          iVar16 = iVar15 * 6;
          fVar19 = -1.0;
        }
        else {
          fVar19 = fVar18 + fVar18 + -1.0;
          iVar16 = iVar13;
          if (iVar3 != 1) {
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar10,"Unsupported shader output layout qualifier requested",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                       ,0x439);
            __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        fVar20 = ((float)iVar16 + 0.5) / (float)(_rendertarget_width & 0xffffffff);
        *(float *)((long)pfVar8 + lVar14) = fVar20 + fVar20 + -1.0;
        *(float *)((long)pfVar8 + lVar14 + 4) = fVar19;
        *(undefined8 *)((long)pfVar8 + lVar14 + 8) = 0x3f80000000000000;
        iVar15 = iVar15 + 1;
        lVar14 = lVar14 + 0x10;
        iVar13 = iVar13 + 7;
      } while( true );
    }
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,
               "Unsupported output layout qualifier type requested for \'points\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x3ff);
  }
  else {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,
               "Only GL_POINTS draw call mode is supported for \'points\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x3f8);
  }
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryShaderRenderingPointsCase::GeometryShaderRenderingPointsCase(Context& context, const ExtParameters& extParams,
																	 const char* name, glw::GLenum drawcall_mode,
																	 _shader_output_type output_type)
	: GeometryShaderRenderingCase(
		  context, extParams, name,
		  "Verifies all draw calls work correctly for specific input+output+draw call mode combination")
	, m_output_type(output_type)
{
	/* Sanity checks */
	if (drawcall_mode != GL_POINTS)
	{
		TCU_FAIL("Only GL_POINTS draw call mode is supported for 'points' geometry shader input layout qualifier test "
				 "implementation");
	}

	if (output_type != SHADER_OUTPUT_TYPE_POINTS && output_type != SHADER_OUTPUT_TYPE_LINE_STRIP &&
		output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)
	{
		TCU_FAIL("Unsupported output layout qualifier type requested for 'points' geometry shader input layout "
				 "qualifier test implementation");
	}

	/* Retrieve rendertarget resolution for a single-instance case.
	 *
	 * Y coordinates will be dynamically updated in a vertex shader for
	 * multiple-instance tests. That's fine, since in multi-instanced tests
	 * we only expand the rendertarget's height; its width is unaffected.
	 */
	unsigned int rendertarget_height = 0;
	unsigned int rendertarget_width  = 0;

	getRenderTargetSize(1, &rendertarget_width, &rendertarget_height);

	/* Generate raw vertex array data. Note we do not differentiate between instanced and
	 * non-instanced cases for geometry shaders that emit points */
	const unsigned int raw_array_data_size = getRawArraysDataBufferSize(false);

	m_raw_array_data = new float[raw_array_data_size / sizeof(float)];

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		switch (m_output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			m_raw_array_data[n_point * 4 + 0] =
				-1 + ((float(3 + 7 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1 + ((float(3.0f + 0.5f)) / float(rendertarget_height)) * 2.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			m_raw_array_data[n_point * 4 + 0] =
				-1 + ((float(1 + 5 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1 + (float(1.5f + 0.5f) / float(rendertarget_height)) * 2.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			m_raw_array_data[n_point * 4 + 0] = -1 + ((float(6 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		default:
		{
			TCU_FAIL("Unsupported shader output layout qualifier requested");
		}
		} /* switch (m_output_type) */
	}	 /* for (all points) */

	/* Generate unordered data - we do not differentiate between instanced & non-instanced cases
	 * for "points" tests
	 */
	const unsigned int unordered_array_data_size	= getUnorderedArraysDataBufferSize(false);
	const unsigned int unordered_elements_data_size = getUnorderedElementsDataBufferSize(false);

	m_unordered_array_data	= new float[unordered_array_data_size / sizeof(float)];
	m_unordered_elements_data = new unsigned char[unordered_elements_data_size];

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		memcpy(m_unordered_array_data + n_point * 4, m_raw_array_data + (8 - n_point - 1) * 4,
			   sizeof(float) * 4 /* components */);
	} /* for (all points) */

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		m_unordered_elements_data[n_point] = (unsigned char)((n_point * 2) % 8 + n_point / 4);
	} /* for (all points) */
}